

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O3

void decode_fglrx_ioctl_config(fglrx_ioctl_config *d,mmt_memory_dump *args,int argc)

{
  mmt_buf *buf;
  mmt_buf *buf_00;
  mmt_buf *buf_01;
  bool bVar1;
  bool bVar2;
  mmt_buf *local_48;
  
  bVar2 = true;
  bVar1 = true;
  if (fglrx_show_unk_zero_fields != 0 || d->unk00 != 0) {
    fprintf(_stdout,"%sunk00: 0x%08x",fglrx_pfx);
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk04 != 0) || (!bVar1)) {
    fprintf(_stdout,"%sunk04: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk08 != 0) || (!bVar2)) {
    fprintf(_stdout,"%sunk08: 0x%08x",", ");
  }
  fglrx_pfx = ", ";
  fprintf(_stdout,"%susername_len: %d",", ",(ulong)d->username_len);
  fglrx_pfx = ", ";
  if (d->username == 0) {
    buf = (mmt_buf *)0x0;
    fprintf(_stdout,"%susername: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%susername: 0x%016lx",", ");
    if (0 < argc) {
      buf = find_ptr(d->username,args,argc);
      if (buf != (mmt_buf *)0x0) goto LAB_0024c410;
    }
    fputs(" [no data]",_stdout);
    buf = (mmt_buf *)0x0;
  }
LAB_0024c410:
  fglrx_pfx = ", ";
  fprintf(_stdout,"%snamespace_len: %d",", ",(ulong)d->namespace_len);
  fglrx_pfx = ", ";
  if (d->_pad1c != 0) {
    fprintf(_stdout,"%s%s_pad1c: 0x%08x%s",", ",colors->err,(ulong)d->_pad1c,colors->reset);
  }
  fglrx_pfx = ", ";
  if (d->namespace == 0) {
    local_48 = (mmt_buf *)0x0;
    fprintf(_stdout,"%snamespace: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%snamespace: 0x%016lx",", ");
    if (0 < argc) {
      local_48 = find_ptr(d->namespace,args,argc);
      if (local_48 != (mmt_buf *)0x0) goto LAB_0024c4ec;
    }
    fputs(" [no data]",_stdout);
    local_48 = (mmt_buf *)0x0;
  }
LAB_0024c4ec:
  fglrx_pfx = ", ";
  fprintf(_stdout,"%sprop_name_len: %d",", ",(ulong)d->prop_name_len);
  fglrx_pfx = ", ";
  if (d->_pad2c != 0) {
    fprintf(_stdout,"%s%s_pad2c: 0x%08x%s",", ",colors->err,(ulong)d->_pad2c,colors->reset);
  }
  fglrx_pfx = ", ";
  if (d->prop_name == 0) {
    buf_00 = (mmt_buf *)0x0;
    fprintf(_stdout,"%sprop_name: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%sprop_name: 0x%016lx",", ");
    if (0 < argc) {
      buf_00 = find_ptr(d->prop_name,args,argc);
      if (buf_00 != (mmt_buf *)0x0) goto LAB_0024c5c2;
    }
    fputs(" [no data]",_stdout);
    buf_00 = (mmt_buf *)0x0;
  }
LAB_0024c5c2:
  fglrx_pfx = ", ";
  bVar1 = true;
  bVar2 = true;
  if (fglrx_show_unk_zero_fields != 0 || d->unk38 != 0) {
    fprintf(_stdout,"%sunk38: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk3c != 0) || (!bVar2)) {
    fprintf(_stdout,"%sunk3c: 0x%08x",", ");
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk40 != 0) || (bVar2 = true, !bVar1)) {
    fprintf(_stdout,"%sunk40: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk44 != 0) || (bVar1 = true, !bVar2)) {
    fprintf(_stdout,"%sunk44: 0x%08x",", ");
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk48 != 0) || (bVar2 = true, !bVar1)) {
    fprintf(_stdout,"%sunk48: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk4c != 0) || (!bVar2)) {
    fprintf(_stdout,"%sunk4c: 0x%08x",", ");
  }
  fglrx_pfx = ", ";
  fprintf(_stdout,"%sprop_value_len: %d",", ",(ulong)d->prop_value_len);
  fglrx_pfx = ", ";
  if (d->_pad54 != 0) {
    fprintf(_stdout,"%s%s_pad54: 0x%08x%s",", ",colors->err,(ulong)d->_pad54,colors->reset);
  }
  fglrx_pfx = ", ";
  if (d->prop_value == 0) {
    buf_01 = (mmt_buf *)0x0;
    fprintf(_stdout,"%sprop_value: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%sprop_value: 0x%016lx",", ");
    if (0 < argc) {
      buf_01 = find_ptr(d->prop_value,args,argc);
      if (buf_01 != (mmt_buf *)0x0) goto LAB_0024c7f2;
    }
    fputs(" [no data]",_stdout);
    buf_01 = (mmt_buf *)0x0;
  }
LAB_0024c7f2:
  fglrx_pfx = ", ";
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (buf != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(buf,"username");
  }
  if (local_48 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(local_48,"namespace");
  }
  if (buf_00 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(buf_00,"prop_name");
  }
  if (buf_01 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_text(buf_01,"prop_value");
    return;
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_config(struct fglrx_ioctl_config *d, struct mmt_memory_dump *args, int argc)
{
	fglrx_print_x32(d, unk00);
	fglrx_print_x32(d, unk04);
	fglrx_print_x32(d, unk08);
	fglrx_print_d32(d, username_len);
	struct mmt_buf *data1 = fglrx_print_ptr(d, username, args, argc);
	fglrx_print_d32(d, namespace_len);
	fglrx_print_pad_x32(d, _pad1c);
	struct mmt_buf *data2 = fglrx_print_ptr(d, namespace, args, argc);
	fglrx_print_d32(d, prop_name_len);
	fglrx_print_pad_x32(d, _pad2c);
	struct mmt_buf *data3 = fglrx_print_ptr(d, prop_name, args, argc);
	fglrx_print_x32(d, unk38);
	fglrx_print_x32(d, unk3c);
	fglrx_print_x32(d, unk40);
	fglrx_print_x32(d, unk44);
	fglrx_print_x32(d, unk48);
	fglrx_print_x32(d, unk4c);
	fglrx_print_d32(d, prop_value_len);
	fglrx_print_pad_x32(d, _pad54);
	struct mmt_buf *data4 = fglrx_print_ptr(d, prop_value, args, argc);
	mmt_log_cont_nl();

	if (data1)
		dump_mmt_buf_as_text(data1, "username");
	if (data2)
		dump_mmt_buf_as_text(data2, "namespace");
	if (data3)
		dump_mmt_buf_as_text(data3, "prop_name");
	if (data4)
		dump_mmt_buf_as_text(data4, "prop_value");
}